

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O0

Int32 __thiscall
Diligent::
DeviceObjectBase<Diligent::ISamplerGL,_Diligent::RenderDeviceGLImpl,_Diligent::SamplerDesc>::
GetUniqueID(DeviceObjectBase<Diligent::ISamplerGL,_Diligent::RenderDeviceGLImpl,_Diligent::SamplerDesc>
            *this)

{
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  DeviceObjectBase<Diligent::ISamplerGL,_Diligent::RenderDeviceGLImpl,_Diligent::SamplerDesc>
  *this_local;
  
  if (this->m_UniqueID == 0) {
    msg.field_2._8_8_ = this;
    FormatString<char[103]>
              ((string *)local_30,
               (char (*) [103])
               "Unique ID is not initialized. This indicates that this device object has been created without a device"
              );
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetUniqueID",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
               ,0xa1);
    std::__cxx11::string::~string((string *)local_30);
  }
  return this->m_UniqueID;
}

Assistant:

GetUniqueID() const override final
    {
        VERIFY(m_UniqueID != 0, "Unique ID is not initialized. This indicates that this device object has been created without a device");
        return m_UniqueID;
    }